

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<long>,_void>::visit
          (ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<long>,_void> *this,Arg *arg)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  ulong *puVar5;
  
  switch(arg->type) {
  case INT:
  case CHAR:
    uVar1 = (arg->super_Value).field_0.int_value;
    uVar4 = (ulong)(int)uVar1;
    if ((*(int *)(this + 8) == 0x69) || (*(int *)(this + 8) == 100)) goto LAB_00139eef;
    puVar5 = *(ulong **)this;
    *(undefined4 *)(puVar5 + 2) = 5;
    uVar4 = (ulong)uVar1;
    goto LAB_00139f2c;
  case UINT:
    uVar4 = (ulong)(arg->super_Value).field_0.uint_value;
    break;
  case LONG_LONG:
  case ULONG_LONG:
    uVar4 = (arg->super_Value).field_0.long_long_value;
    break;
  case BOOL:
    iVar2 = (arg->super_Value).field_0.int_value;
    iVar3 = *(int *)(this + 8);
    if (iVar3 != 100) {
      if (iVar3 == 0x73) {
        return;
      }
      if (iVar3 != 0x69) {
        puVar5 = *(ulong **)this;
        *(undefined4 *)(puVar5 + 2) = 5;
        goto LAB_00139f41;
      }
    }
    puVar5 = *(ulong **)this;
    *(undefined4 *)(puVar5 + 2) = 4;
LAB_00139f41:
    *puVar5 = (ulong)(iVar2 != 0);
    return;
  default:
    goto switchD_00139ebb_default;
  }
  if ((*(int *)(this + 8) == 0x69) || (*(int *)(this + 8) == 100)) {
LAB_00139eef:
    puVar5 = *(ulong **)this;
    *(undefined4 *)(puVar5 + 2) = 4;
  }
  else {
    puVar5 = *(ulong **)this;
    *(undefined4 *)(puVar5 + 2) = 5;
  }
LAB_00139f2c:
  *puVar5 = uVar4;
switchD_00139ebb_default:
  return;
}

Assistant:

Result visit(const Arg &arg) {
    switch (arg.type) {
    case Arg::NONE:
    case Arg::NAMED_ARG:
      FMT_ASSERT(false, "invalid argument type");
      break;
    case Arg::INT:
      return FMT_DISPATCH(visit_int(arg.int_value));
    case Arg::UINT:
      return FMT_DISPATCH(visit_uint(arg.uint_value));
    case Arg::LONG_LONG:
      return FMT_DISPATCH(visit_long_long(arg.long_long_value));
    case Arg::ULONG_LONG:
      return FMT_DISPATCH(visit_ulong_long(arg.ulong_long_value));
    case Arg::BOOL:
      return FMT_DISPATCH(visit_bool(arg.int_value != 0));
    case Arg::CHAR:
      return FMT_DISPATCH(visit_char(arg.int_value));
    case Arg::DOUBLE:
      return FMT_DISPATCH(visit_double(arg.double_value));
    case Arg::LONG_DOUBLE:
      return FMT_DISPATCH(visit_long_double(arg.long_double_value));
    case Arg::CSTRING:
      return FMT_DISPATCH(visit_cstring(arg.string.value));
    case Arg::STRING:
      return FMT_DISPATCH(visit_string(arg.string));
    case Arg::WSTRING:
      return FMT_DISPATCH(visit_wstring(arg.wstring));
    case Arg::POINTER:
      return FMT_DISPATCH(visit_pointer(arg.pointer));
    case Arg::CUSTOM:
      return FMT_DISPATCH(visit_custom(arg.custom));
    }
    return Result();
  }